

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O3

int tr_tcp_recv(void *tr_tcp_sock,void *pdu,size_t len,time_t timeout)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  int __flags;
  undefined8 uVar5;
  char *frmt;
  undefined8 uVar6;
  long in_FS_OFFSET;
  timeval t;
  time_t local_30 [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (timeout == 0) {
    iVar1 = *tr_tcp_sock;
    __flags = 0x40;
LAB_001090ff:
    sVar2 = recv(iVar1,pdu,len,__flags);
    iVar1 = (int)sVar2;
    if (iVar1 == 0) {
      iVar1 = -4;
      goto LAB_00109179;
    }
    if (iVar1 != -1) goto LAB_00109179;
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    if (iVar1 == 0xb) {
      iVar1 = -2;
      goto LAB_00109179;
    }
    if (iVar1 == 4) {
      iVar1 = -3;
      goto LAB_00109179;
    }
    uVar6 = *(undefined8 *)((long)tr_tcp_sock + 8);
    uVar5 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
    pcVar4 = strerror(iVar1);
    frmt = "TCP Transport(%s:%s): recv(..) error: %s";
  }
  else {
    local_30[1] = 0;
    local_30[0] = timeout;
    iVar1 = setsockopt(*tr_tcp_sock,1,0x14,local_30,0x10);
    if (iVar1 != -1) {
      iVar1 = *tr_tcp_sock;
      __flags = 0;
      goto LAB_001090ff;
    }
    uVar6 = *(undefined8 *)((long)tr_tcp_sock + 8);
    uVar5 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    frmt = "TCP Transport(%s:%s): setting SO_RCVTIMEO failed, %s";
  }
  lrtr_dbg(frmt,uVar6,uVar5,pcVar4);
  iVar1 = -1;
LAB_00109179:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int tr_tcp_recv(const void *tr_tcp_sock, void *pdu, const size_t len, const time_t timeout)
{
	const struct tr_tcp_socket *tcp_socket = tr_tcp_sock;
	int rtval;

	if (timeout == 0) {
		rtval = recv(tcp_socket->socket, pdu, len, MSG_DONTWAIT);
	} else {
		struct timeval t = {timeout, 0};

		if (setsockopt(tcp_socket->socket, SOL_SOCKET, SO_RCVTIMEO, &t, sizeof(t)) == -1) {
			TCP_DBG("setting SO_RCVTIMEO failed, %s", tcp_socket, strerror(errno));
			return TR_ERROR;
		}
		rtval = recv(tcp_socket->socket, pdu, len, 0);
	}

	if (rtval == -1) {
		if (errno == EAGAIN || errno == EWOULDBLOCK)
			return TR_WOULDBLOCK;
		if (errno == EINTR)
			return TR_INTR;
		TCP_DBG("recv(..) error: %s", tcp_socket, strerror(errno));
		return TR_ERROR;
	}
	if (rtval == 0)
		return TR_CLOSED;
	return rtval;
}